

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_avx2.c
# Opt level: O3

parasail_profile_t *
parasail_profile_create_stats_avx_256_32(char *s1,int _s1Len,parasail_matrix_t *matrix)

{
  undefined8 *puVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  parasail_profile_t *ppVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  size_t size;
  uint uVar19;
  __m256i_32_t s;
  __m256i_32_t m;
  __m256i_32_t p;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  if (matrix == (parasail_matrix_t *)0x0) {
    parasail_profile_create_stats_avx_256_32_cold_2();
  }
  else if (s1 == (char *)0x0) {
    parasail_profile_create_stats_avx_256_32_cold_1();
  }
  else {
    if (matrix->type != 0) {
      _s1Len = matrix->length;
    }
    uVar2 = matrix->size;
    iVar4 = _s1Len + 0xe;
    if (-1 < _s1Len + 7) {
      iVar4 = _s1Len + 7;
    }
    uVar19 = iVar4 >> 3;
    size = (long)(int)(uVar19 * uVar2) << 5;
    pvVar5 = parasail_memalign(0x20,size);
    if ((((pvVar5 != (void *)0x0) && (pvVar6 = parasail_memalign(0x20,size), pvVar6 != (void *)0x0))
        && (pvVar7 = parasail_memalign(0x20,size), pvVar7 != (void *)0x0)) &&
       (ppVar8 = parasail_profile_new(s1,_s1Len,matrix), ppVar8 != (parasail_profile_t *)0x0)) {
      if (0 < (int)uVar2) {
        uVar9 = 1;
        if (1 < (int)uVar19) {
          uVar9 = (ulong)uVar19;
        }
        uVar12 = 0;
        lVar15 = 0;
        do {
          if (0 < _s1Len) {
            lVar15 = (long)(int)lVar15;
            iVar4 = 0;
            uVar11 = 0;
            do {
              iVar3 = matrix->type;
              lVar10 = 0;
              uVar17 = uVar11;
              iVar18 = iVar4;
              do {
                iVar16 = (int)uVar17;
                if (iVar3 == 0) {
                  if (iVar16 < _s1Len) {
                    iVar13 = matrix->mapper[(byte)s1[uVar17]] + (int)uVar12 * uVar2;
                    goto LAB_007a68b1;
                  }
LAB_007a68be:
                  iVar13 = 0;
                }
                else {
                  if (_s1Len <= iVar16) goto LAB_007a68be;
                  iVar13 = matrix->mapper[(byte)matrix->alphabet[uVar12]] + iVar18;
LAB_007a68b1:
                  iVar13 = matrix->matrix[iVar13];
                }
                *(int *)((long)&local_80 + lVar10 * 4) = iVar13;
                uVar14 = 0;
                if (iVar16 < _s1Len) {
                  uVar14 = (uint)(uVar12 == (uint)matrix->mapper[(byte)s1[uVar17]]);
                }
                *(uint *)((long)&local_a0 + lVar10 * 4) = uVar14;
                *(uint *)((long)&local_c0 + lVar10 * 4) = (uint)(0 < iVar13);
                uVar17 = uVar17 + uVar19;
                lVar10 = lVar10 + 1;
                iVar18 = iVar18 + uVar19 * uVar2;
              } while (lVar10 != 8);
              lVar10 = lVar15 * 0x20;
              puVar1 = (undefined8 *)((long)pvVar5 + lVar10);
              *puVar1 = local_80;
              puVar1[1] = uStack_78;
              puVar1[2] = uStack_70;
              puVar1[3] = uStack_68;
              puVar1 = (undefined8 *)((long)pvVar6 + lVar10);
              *puVar1 = local_a0;
              puVar1[1] = uStack_98;
              puVar1[2] = uStack_90;
              puVar1[3] = uStack_88;
              puVar1 = (undefined8 *)((long)pvVar7 + lVar10);
              *puVar1 = local_c0;
              puVar1[1] = uStack_b8;
              puVar1[2] = uStack_b0;
              puVar1[3] = uStack_a8;
              lVar15 = lVar15 + 1;
              uVar11 = uVar11 + 1;
              iVar4 = iVar4 + uVar2;
            } while (uVar11 != uVar9);
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar2);
      }
      (ppVar8->profile32).score = pvVar5;
      (ppVar8->profile32).matches = pvVar6;
      (ppVar8->profile32).similar = pvVar7;
      ppVar8->free = parasail_free___m256i;
      return ppVar8;
    }
  }
  return (parasail_profile_t *)0x0;
}

Assistant:

parasail_profile_t * parasail_profile_create_stats_avx_256_32(
        const char * const restrict s1, const int _s1Len,
        const parasail_matrix_t *matrix)
{
    int s1Len = 0;
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t segNum = 0;
    int32_t n = 0;
    const int32_t segWidth = 8; /* number of values in vector unit */
    int32_t segLen = 0;
    __m256i* restrict vProfile = NULL;
    __m256i* restrict vProfileM = NULL;
    __m256i* restrict vProfileS = NULL;
    int32_t index = 0;
    parasail_profile_t *profile = NULL;

    PARASAIL_CHECK_NULL(matrix);
    /* s1 is required for both pssm and square */
    PARASAIL_CHECK_NULL(s1);

    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    n = matrix->size; /* number of amino acids in table */
    segLen = (s1Len + segWidth - 1) / segWidth;
    vProfile = parasail_memalign___m256i(32, n * segLen);
    if (!vProfile) return NULL;
    vProfileM = parasail_memalign___m256i(32, n * segLen);
    if (!vProfileM) return NULL;
    vProfileS = parasail_memalign___m256i(32, n * segLen);
    if (!vProfileS) return NULL;
    profile = parasail_profile_new(s1, s1Len, matrix);
    if (!profile) return NULL;

    for (k=0; k<n; ++k) {
        for (i=0; i<segLen; ++i) {
            __m256i_32_t p;
            __m256i_32_t m;
            __m256i_32_t s;
            j = i;
            for (segNum=0; segNum<segWidth; ++segNum) {
                if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
                    p.v[segNum] = j >= s1Len ? 0 : matrix->matrix[n*k+matrix->mapper[(unsigned char)s1[j]]];
                }
                else {
                    p.v[segNum] = j >= s1Len ? 0 : matrix->matrix[n*j+matrix->mapper[(unsigned char)matrix->alphabet[k]]];
                }
                m.v[segNum] = j >= s1Len ? 0 : (k == matrix->mapper[(unsigned char)s1[j]]);
                s.v[segNum] = p.v[segNum] > 0;
                j += segLen;
            }
            _mm256_store_si256(&vProfile[index], p.m);
            _mm256_store_si256(&vProfileM[index], m.m);
            _mm256_store_si256(&vProfileS[index], s.m);
            ++index;
        }
    }

    profile->profile32.score = vProfile;
    profile->profile32.matches = vProfileM;
    profile->profile32.similar = vProfileS;
    profile->free = &parasail_free___m256i;
    return profile;
}